

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkCompleteStep(ARKodeMem ark_mem,realtype dsm)

{
  double dVar1;
  realtype rVar2;
  ARKodeHAdaptMem pAVar3;
  int iVar4;
  double dVar5;
  
  dVar5 = ark_mem->tn + ark_mem->h;
  ark_mem->tcur = dVar5;
  if ((ark_mem->tstopset != 0) &&
     (dVar1 = ark_mem->tstop,
     ABS(dVar5 - dVar1) <= (ABS(ark_mem->h) + ABS(dVar5)) * ark_mem->uround * 100.0)) {
    ark_mem->tcur = dVar1;
    dVar5 = dVar1;
  }
  if ((ark_mem->ProcessStep != (ARKPostProcessFn)0x0) &&
     (iVar4 = (*ark_mem->ProcessStep)(dVar5,ark_mem->ycur,ark_mem->ps_data), iVar4 != 0)) {
    return -0x25;
  }
  if ((ark_mem->interp != (ARKInterp)0x0) &&
     (iVar4 = arkInterpUpdate(ark_mem,ark_mem->interp,ark_mem->tcur), iVar4 != 0)) {
    return iVar4;
  }
  if ((ark_mem->call_fullrhs != 0) &&
     (iVar4 = (*ark_mem->step_fullrhs)
                        (ark_mem,ark_mem->tcur,ark_mem->ycur,ark_mem->fn,
                         SUB14(ark_mem->ProcessStep == (ARKPostProcessFn)0x0,0)), iVar4 != 0)) {
    return -8;
  }
  N_VScale(1.0,ark_mem->ycur,ark_mem->yn);
  pAVar3 = ark_mem->hadapt_mem;
  rVar2 = pAVar3->hhist[0];
  pAVar3->ehist[1] = pAVar3->ehist[0];
  pAVar3->ehist[0] = dsm * pAVar3->bias;
  pAVar3->hhist[1] = rVar2;
  dVar5 = ark_mem->h;
  pAVar3->hhist[0] = dVar5;
  ark_mem->nst = ark_mem->nst + 1;
  ark_mem->hold = dVar5;
  ark_mem->tn = ark_mem->tcur;
  ark_mem->hprime = dVar5 * ark_mem->eta;
  pAVar3->etamax = pAVar3->growth;
  ark_mem->initsetup = 0;
  ark_mem->firststage = 0;
  return 0;
}

Assistant:

int arkCompleteStep(ARKodeMem ark_mem, realtype dsm)
{
  int retval, mode;
  realtype troundoff;

  /* Set current time to the end of the step (in case the last
     stage time does not coincide with the step solution time).
     If tstop is enabled, it is possible for tn + h to be past
     tstop by roundoff, and in that case, we reset tn (after
     incrementing by h) to tstop. */
  ark_mem->tcur = ark_mem->tn + ark_mem->h;
  if ( ark_mem->tstopset ) {
    troundoff = FUZZ_FACTOR * ark_mem->uround *
      (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
    if ( SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
      ark_mem->tcur = ark_mem->tstop;
  }

#ifdef SUNDIALS_DEBUG
  printf("ARKODE end step %li,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

  /* apply user-supplied step postprocessing function (if supplied) */
  if (ark_mem->ProcessStep != NULL) {
    retval = ark_mem->ProcessStep(ark_mem->tcur,
                                  ark_mem->ycur,
                                  ark_mem->ps_data);
    if (retval != 0) return(ARK_POSTPROCESS_STEP_FAIL);
  }

  /* update interpolation structure */
  if (ark_mem->interp != NULL) {
    retval = arkInterpUpdate(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != ARK_SUCCESS)  return(retval);
  }

  /* call fullrhs if needed */
  if (ark_mem->call_fullrhs) {
    mode = (ark_mem->ProcessStep != NULL) ? ARK_FULLRHS_START : ARK_FULLRHS_END;
    retval = ark_mem->step_fullrhs(ark_mem, ark_mem->tcur, ark_mem->ycur,
                                   ark_mem->fn, mode);
    if (retval != 0) return(ARK_RHSFUNC_FAIL);
  }

  /* update yn to current solution */
  N_VScale(ONE, ark_mem->ycur, ark_mem->yn);

  /* Update step size and error history arrays */
  ark_mem->hadapt_mem->ehist[1] = ark_mem->hadapt_mem->ehist[0];
  ark_mem->hadapt_mem->ehist[0] = dsm*ark_mem->hadapt_mem->bias;
  ark_mem->hadapt_mem->hhist[1] = ark_mem->hadapt_mem->hhist[0];
  ark_mem->hadapt_mem->hhist[0] = ark_mem->h;

  /* update scalar quantities */
  ark_mem->nst++;
  ark_mem->hold   = ark_mem->h;
  ark_mem->tn     = ark_mem->tcur;
  ark_mem->hprime = ark_mem->h * ark_mem->eta;

  /* Reset growth factor for subsequent time step */
  ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;

  /* Turn off flag indicating initial step and first stage */
  ark_mem->initsetup  = SUNFALSE;
  ark_mem->firststage = SUNFALSE;

  return(ARK_SUCCESS);
}